

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut_pex.cpp
# Opt level: O0

void __thiscall
libtorrent::(anonymous_namespace)::ut_pex_peer_plugin::on_extension_handshake
          (ut_pex_peer_plugin *this)

{
  bdecode_node *in_RSI;
  
  anon_unknown_6::ut_pex_peer_plugin::on_extension_handshake
            ((ut_pex_peer_plugin *)(this + -0x38),in_RSI);
  return;
}

Assistant:

bool on_extension_handshake(bdecode_node const& h) override
		{
			m_message_index = 0;
			if (h.type() != bdecode_node::dict_t) return false;
			bdecode_node const messages = h.dict_find_dict("m");
			if (!messages) return false;

			int const index = int(messages.dict_find_int_value(extension_name, -1));
			if (index == -1) return false;
			m_message_index = index;
			return true;
		}